

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticSynapse.cpp
# Opt level: O2

void __thiscall StaticSynapse::update(StaticSynapse *this)

{
  Event *pEVar1;
  Population *pPVar2;
  Scalar *pSVar3;
  int j;
  long row;
  int i;
  ulong col;
  
  for (col = 0; (long)col < (long)this->outputSize; col = col + 1) {
    for (row = 0; row < this->inputSize; row = row + 1) {
      pEVar1 = (((this->super_Synapse).from_population)->output).
               super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data
               ._M_start[row];
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          &this->weights,row,col);
      (**pEVar1->_vptr_Event)(*pSVar3,pEVar1);
      pPVar2 = (this->super_Synapse).to_population;
      (*pPVar2->_vptr_Population[5])
                (pPVar2,col & 0xffffffff,
                 (((this->super_Synapse).from_population)->output).
                 super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                 super__Vector_impl_data._M_start[row]);
    }
  }
  return;
}

Assistant:

void StaticSynapse::update() {
    for(int i = 0; i < outputSize; i++) {
        for(int j = 0; j < inputSize; j++) {
            from_population->output[j]->setWeight(weights(j, i));
            to_population->setInput(i, from_population->output[j]);
        }
    }
}